

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O0

int http_get(HTTP_INFO *hi,char *url,char *response,int size)

{
  int iVar1;
  size_t sVar2;
  socklen_t local_9d4;
  int local_9d0;
  socklen_t slen;
  int len;
  int opt;
  int ret;
  int verify;
  int https;
  int sock_fd;
  char dir [1024];
  char port [10];
  char host [256];
  char err [100];
  char local_438 [8];
  char request [1024];
  int size_local;
  char *response_local;
  char *url_local;
  HTTP_INFO *hi_local;
  
  if (hi == (HTTP_INFO *)0x0) {
    return -1;
  }
  opt = (int)(hi->tls).verify;
  parse_url(url,&ret,port + 2,dir + 0x3fe,(char *)&https);
  if ((((hi->tls).ssl_fd.fd != -1) && ((uint)(hi->url).https == ret)) &&
     (iVar1 = strcmp((hi->url).host,port + 2), iVar1 == 0)) {
    iVar1 = strcmp((hi->url).port,dir + 0x3fe);
    if (iVar1 == 0) {
      verify = (hi->tls).ssl_fd.fd;
      local_9d4 = 4;
      iVar1 = getsockopt(verify,1,4,&slen,&local_9d4);
      if ((iVar1 < 0) || (0 < (int)slen)) {
        https_close(hi);
        https_init(hi,(BOOL)ret,(BOOL)opt);
        len = https_connect(hi,port + 2,dir + 0x3fe);
        if (len < 0) {
          https_close(hi);
          mbedtls_strerror(len,host + 0xf8,100);
          snprintf(response,0x100,"socket error: %s(%d)",host + 0xf8,(ulong)(uint)len);
          return -1;
        }
      }
      goto LAB_0010fc83;
    }
  }
  https_close(hi);
  https_init(hi,(BOOL)ret,(BOOL)opt);
  len = https_connect(hi,port + 2,dir + 0x3fe);
  if (len < 0) {
    https_close(hi);
    mbedtls_strerror(len,host + 0xf8,100);
    snprintf(response,0x100,"socket error: %s(%d)",host + 0xf8,(ulong)(uint)len);
    return -1;
  }
LAB_0010fc83:
  local_9d0 = snprintf(local_438,0x400,
                       "GET %s HTTP/1.1\r\nUser-Agent: Mozilla/4.0\r\nHost: %s:%s\r\nContent-Type: application/json; charset=utf-8\r\nConnection: Keep-Alive\r\n%s\r\n"
                       ,&https,port + 2,dir + 0x3fe,(hi->request).cookie);
  len = https_write(hi,local_438,local_9d0);
  if (len == local_9d0) {
    (hi->response).status = 0;
    (hi->response).content_length = 0;
    (hi->response).close = '\0';
    hi->r_len = 0;
    hi->header_end = '\0';
    hi->body = response;
    hi->body_size = (long)size;
    hi->body_len = 0;
    do {
      do {
        len = https_read(hi,hi->r_buf + hi->r_len,0x800 - (int)hi->r_len);
      } while (len == -0x6900);
      if (len < 0) {
        https_close(hi);
        mbedtls_strerror(len,host + 0xf8,100);
        snprintf(response,0x100,"socket error: %s(%d)",host + 0xf8,(ulong)(uint)len);
        return -1;
      }
      if (len == 0) {
        https_close(hi);
        break;
      }
      hi->r_len = (long)len + hi->r_len;
      hi->r_buf[hi->r_len] = '\0';
      iVar1 = http_parse(hi);
    } while (iVar1 == 0);
    if ((hi->response).close == '\x01') {
      https_close(hi);
    }
    else {
      sVar2 = strlen(port + 2);
      strncpy((hi->url).host,port + 2,sVar2);
      sVar2 = strlen(dir + 0x3fe);
      strncpy((hi->url).port,dir + 0x3fe,sVar2);
      sVar2 = strlen((char *)&https);
      strncpy((hi->url).path,(char *)&https,sVar2);
    }
    hi_local._4_4_ = (hi->response).status;
  }
  else {
    https_close(hi);
    mbedtls_strerror(len,host + 0xf8,100);
    snprintf(response,0x100,"socket error: %s(%d)",host + 0xf8,(ulong)(uint)len);
    hi_local._4_4_ = -1;
  }
  return hi_local._4_4_;
}

Assistant:

int http_get(HTTP_INFO *hi, char *url, char *response, int size)
{
    char        request[1024], err[100];
    char        host[256], port[10], dir[1024];
    int         sock_fd, https, verify;
    int         ret, opt, len;
    socklen_t   slen;


    if(NULL == hi) return -1;

    verify = hi->tls.verify;

    parse_url(url, &https, host, port, dir);

    if( (hi->tls.ssl_fd.fd == -1) || (hi->url.https != https) ||
        (strcmp(hi->url.host, host) != 0) || (strcmp(hi->url.port, port) != 0) )
    {
        https_close(hi);

        https_init(hi, https, verify);

        if((ret=https_connect(hi, host, port)) < 0)
        {
            https_close(hi);

            mbedtls_strerror(ret, err, 100);
            snprintf(response, 256, "socket error: %s(%d)", err, ret);
            return -1;
        }
    }
    else
    {
        sock_fd = hi->tls.ssl_fd.fd;

        slen = sizeof(int);

        if((getsockopt(sock_fd, SOL_SOCKET, SO_ERROR, (void *)&opt, &slen) < 0) || (opt > 0))
        {
            https_close(hi);

            https_init(hi, https, verify);

            if((ret=https_connect(hi, host, port)) < 0)
            {
                https_close(hi);

                mbedtls_strerror(ret, err, 100);
                snprintf(response, 256, "socket error: %s(%d)", err, ret);
                return -1;
            }
        }
    }

    /* Send HTTP request. */
    len = snprintf(request, 1024,
            "GET %s HTTP/1.1\r\n"
            "User-Agent: Mozilla/4.0\r\n"
            "Host: %s:%s\r\n"
            "Content-Type: application/json; charset=utf-8\r\n"
            "Connection: Keep-Alive\r\n"
            "%s\r\n",
            dir, host, port, hi->request.cookie);

    if((ret = https_write(hi, request, len)) != len)
    {
        https_close(hi);

        mbedtls_strerror(ret, err, 100);

        snprintf(response, 256, "socket error: %s(%d)", err, ret);

        return -1;
    }

//  printf("request: %s \r\n\r\n", request);

    hi->response.status = 0;
    hi->response.content_length = 0;
    hi->response.close = 0;

    hi->r_len = 0;
    hi->header_end = 0;

    hi->body = response;
    hi->body_size = size;
    hi->body_len = 0;

    while(1)
    {
        ret = https_read(hi, &hi->r_buf[hi->r_len], (int)(H_READ_SIZE - hi->r_len));
        if(ret == MBEDTLS_ERR_SSL_WANT_READ) continue;
        else if(ret < 0)
        {
            https_close(hi);

            mbedtls_strerror(ret, err, 100);

            snprintf(response, 256, "socket error: %s(%d)", err, ret);

            return -1;
        }
        else if(ret == 0)
        {
            https_close(hi);
            break;
        }

        hi->r_len += ret;
        hi->r_buf[hi->r_len] = 0;

        // printf("read(%ld): |%s| \n", hi->r_len, hi->r_buf);
        // printf("read(%ld) ... \n", hi->r_len);

        if(http_parse(hi) != 0) break;
    }

    if(hi->response.close == 1)
    {
        https_close(hi);
    }
    else
    {
        strncpy(hi->url.host, host, strlen(host));
        strncpy(hi->url.port, port, strlen(port));
        strncpy(hi->url.path, dir, strlen(dir));
    }

    /*
    printf("status: %d \n", hi->response.status);
    printf("cookie: %s \n", hi->response.cookie);
    printf("location: %s \n", hi->response.location);
    printf("referrer: %s \n", hi->response.referrer);
    printf("length: %ld \n", hi->response.content_length);
    printf("body: %ld \n", hi->body_len);
    */

    return hi->response.status;

}